

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorTarget.cxx
# Opt level: O0

string * __thiscall
cmGeneratorTarget::GetFeatureSpecificLinkRuleVariable
          (string *__return_storage_ptr__,cmGeneratorTarget *this,string *var,string *lang,
          string *config)

{
  bool bVar1;
  string *config_local;
  string *lang_local;
  string *var_local;
  cmGeneratorTarget *this_local;
  string *varIPO;
  
  bVar1 = IsIPOEnabled(this,lang,config);
  if (bVar1) {
    std::operator+(__return_storage_ptr__,var,"_IPO");
    bVar1 = cmMakefile::IsDefinitionSet(this->Makefile,__return_storage_ptr__);
    if (bVar1) {
      return __return_storage_ptr__;
    }
    std::__cxx11::string::~string((string *)__return_storage_ptr__);
  }
  std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)var);
  return __return_storage_ptr__;
}

Assistant:

std::string cmGeneratorTarget::GetFeatureSpecificLinkRuleVariable(
  std::string const& var, std::string const& lang,
  std::string const& config) const
{
  if (this->IsIPOEnabled(lang, config)) {
    std::string varIPO = var + "_IPO";
    if (this->Makefile->IsDefinitionSet(varIPO)) {
      return varIPO;
    }
  }

  return var;
}